

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O0

void __thiscall Player::Player(Player *this,Dice *d,int i)

{
  string *playerName;
  allocator local_71;
  string local_70 [32];
  string local_50;
  int local_1c;
  Dice *pDStack_18;
  int i_local;
  Dice *d_local;
  Player *this_local;
  
  local_1c = i;
  pDStack_18 = d;
  d_local = (Dice *)this;
  Player(this);
  this->dice = pDStack_18;
  this->playerID = local_1c;
  Dice::setPlayerNumber(this->dice,local_1c);
  std::__cxx11::to_string(&local_50,local_1c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"Random ",&local_71);
  playerName = (string *)std::__cxx11::string::operator+=(local_70,(string *)&local_50);
  setPlayerName(this,playerName);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::__cxx11::string::~string((string *)&local_50);
  setZone(this,10);
  return;
}

Assistant:

Player::Player(Dice* d, int i): Player() {
    this ->dice = d ;
    this ->playerID = i;
    this ->dice->setPlayerNumber(i);
    this ->setPlayerName(std::string("Random ") += to_string(i));
    this ->setZone(10); // Nothing
}